

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O3

int feederBig1(void)

{
  int iVar1;
  FILE *__s;
  uint uVar2;
  
  __s = fopen("in.txt","w+");
  if (__s == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
    iVar1 = -1;
  }
  else {
    fwrite("5000\n1 2501\n5000\n",0x11,1,__s);
    uVar2 = 2;
    do {
      fprintf(__s,"%d %d 1\n",(ulong)(uVar2 - 1),(ulong)uVar2);
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x1389);
    fwrite("5000 1 1\n",9,1,__s);
    fclose(__s);
    LabMemoryLimit = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int feederBig1(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "5000\n1 2501\n5000\n");
    for (i = 0; i < 4999; i++) {
        fprintf(in, "%d %d 1\n", i+1, i+2);
    }
    fprintf(in, "5000 1 1\n");
    fclose(in);
    LabMemoryLimit = 5000*5000*4+MIN_PROCESS_RSS_BYTES;
    return 0;
}